

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.hpp
# Opt level: O0

rt_expr<viennamath::rt_expression_interface<double>_> __thiscall
viennamath::operator*
          (viennamath *this,rt_vector_expr<viennamath::rt_expression_interface<double>_> *lhs,
          rt_vector_expr<viennamath::rt_expression_interface<double>_> *rhs)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  type local_a0;
  type local_80;
  ulong local_60;
  size_t i;
  type local_48;
  undefined1 local_21;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *local_20;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *rhs_local;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *lhs_local;
  rt_expr<viennamath::rt_expression_interface<double>_> *result;
  
  local_20 = rhs;
  rhs_local = lhs;
  lhs_local = (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)this;
  sVar3 = std::
          vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
          ::size((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                  *)(lhs + 8));
  sVar4 = std::
          vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
          ::size((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                  *)(local_20 + 8));
  bVar1 = false;
  if (sVar3 == sVar4) {
    sVar3 = std::
            vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
            ::size((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                    *)(rhs_local + 8));
    bVar1 = false;
    if (sVar3 != 0) {
      bVar1 = true;
    }
  }
  if (bVar1) {
    local_21 = 0;
    pvVar5 = std::
             vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             ::operator[]((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                           *)(rhs_local + 8),0);
    pvVar6 = std::
             vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             ::operator[]((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                           *)(local_20 + 8),0);
    operator*(&local_48,pvVar5,pvVar6);
    rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
              ((rt_expr<viennamath::rt_expression_interface<double>_> *)this,&local_48);
    rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr(&local_48);
    for (local_60 = 1; uVar2 = local_60,
        sVar3 = std::
                vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                ::size((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                        *)(local_20 + 8)), uVar2 < sVar3; local_60 = local_60 + 1) {
      pvVar5 = std::
               vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ::operator[]((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                             *)(rhs_local + 8),local_60);
      pvVar6 = std::
               vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ::operator[]((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                             *)(local_20 + 8),local_60);
      operator*(&local_a0,pvVar5,pvVar6);
      operator+(&local_80,(rt_expr<viennamath::rt_expression_interface<double>_> *)this,&local_a0);
      rt_expr<viennamath::rt_expression_interface<double>_>::operator=
                ((rt_expr<viennamath::rt_expression_interface<double>_> *)this,&local_80);
      rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr(&local_80);
      rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr(&local_a0);
    }
    return (rt_expr<viennamath::rt_expression_interface<double>_>)
           (auto_ptr<const_viennamath::rt_expression_interface<double>_>)this;
  }
  __assert_fail("lhs.size() == rhs.size() && lhs.size() > 0 && \"Invalid or nonmatching size in expression vectors\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/viennamath/runtime/vector_expr.hpp"
                ,0x10e,
                "rt_expr<InterfaceType> viennamath::operator*(const rt_vector_expr<InterfaceType> &, const rt_vector_expr<InterfaceType> &) [InterfaceType = viennamath::rt_expression_interface<double>]"
               );
}

Assistant:

rt_expr<InterfaceType> operator*(rt_vector_expr<InterfaceType> const & lhs, rt_vector_expr<InterfaceType> const & rhs)
  {
    assert(lhs.size() == rhs.size() && lhs.size() > 0 && "Invalid or nonmatching size in expression vectors");

    rt_expr<InterfaceType> result = lhs[0] * rhs[0];
    for (std::size_t i=1; i<rhs.size(); ++i)
      result = result + lhs[i] * rhs[i];

    return result;
  }